

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hpf2_init(ma_hpf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_hpf2 *pHPF)

{
  ma_allocation_callbacks *pAllocationCallbacks_00;
  long in_RDX;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_result result;
  size_t *in_stack_00000030;
  ma_hpf2_config *in_stack_00000038;
  ma_hpf2 *in_stack_00000040;
  void *in_stack_00000048;
  ma_hpf2_config *in_stack_00000050;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  local_4 = ma_hpf2_get_heap_size(in_stack_00000038,in_stack_00000030);
  if (local_4 == MA_SUCCESS) {
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      pAllocationCallbacks_00 = (ma_allocation_callbacks *)0x0;
    }
    else {
      pAllocationCallbacks_00 =
           (ma_allocation_callbacks *)
           ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x1c1561);
      if (pAllocationCallbacks_00 == (ma_allocation_callbacks *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    local_4 = ma_hpf2_init_preallocated(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    if (local_4 == MA_SUCCESS) {
      *(undefined4 *)(in_RDX + 0x38) = 1;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffd0,pAllocationCallbacks_00);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_hpf2_init(const ma_hpf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_hpf2* pHPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_hpf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_hpf2_init_preallocated(pConfig, pHeap, pHPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pHPF->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}